

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

int duckdb_brotli::BrotliDecoderIsFinished(BrotliDecoderStateInternal *s)

{
  int iVar1;
  int *in_RDI;
  BrotliDecoderStateInternal *in_stack_ffffffffffffffe8;
  byte local_9;
  
  local_9 = 0;
  if (*in_RDI == 0x1a) {
    iVar1 = BrotliDecoderHasMoreOutput(in_stack_ffffffffffffffe8);
    local_9 = iVar1 != 0 ^ 0xff;
  }
  return (int)(local_9 & 1);
}

Assistant:

BROTLI_BOOL BrotliDecoderIsFinished(const BrotliDecoderState *s) {
	return TO_BROTLI_BOOL(s->state == BROTLI_STATE_DONE) && !BrotliDecoderHasMoreOutput(s);
}